

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O2

RK_S32 av1d_split_frame(Av1CodecContext *ctx,RK_U8 **out_data,RK_S32 *out_size,RK_U8 *data,
                       RK_S32 size)

{
  uint uVar1;
  RK_U32 RVar2;
  long lVar3;
  RK_U8 *buf;
  int local_c8;
  AV1OBU obu;
  
  lVar3 = (long)size;
  if (((byte)av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_split_frame",ctx);
  }
  *out_data = data;
  buf = data;
  do {
    local_c8 = (int)data;
    if ((data + lVar3 <= buf) || (uVar1 = av1_extract_obu(&obu,buf,size), (int)uVar1 < 0)) {
      local_c8 = (int)buf - local_c8;
      *out_size = local_c8;
      return local_c8;
    }
    if ((uint)obu.type < 7) {
      if ((0x26U >> (obu.type & 0x1fU) & 1) == 0) {
        if ((0x48U >> (obu.type & 0x1fU) & 1) == 0) goto LAB_001b5200;
LAB_001b51ee:
        RVar2 = ctx->frame_header + 1;
        ctx->frame_header = RVar2;
        goto LAB_001b5207;
      }
      if (ctx->frame_header != 0) goto LAB_001b51ee;
    }
    else {
LAB_001b5200:
      RVar2 = ctx->frame_header;
LAB_001b5207:
      if (RVar2 == 2) {
LAB_001b522b:
        local_c8 = (int)buf - local_c8;
        *out_size = local_c8;
        ctx->frame_header = 0;
        ctx->new_frame = 1;
        return local_c8;
      }
      if (obu.type == 6) {
        buf = (RK_U8 *)(ulong)((int)buf + uVar1);
        goto LAB_001b522b;
      }
    }
    buf = buf + uVar1;
    size = size - uVar1;
  } while( true );
}

Assistant:

RK_S32 av1d_split_frame(Av1CodecContext *ctx,
                        RK_U8 **out_data, RK_S32 *out_size,
                        RK_U8 *data, RK_S32 size)
{
    (void)out_data;
    (void)out_size;

    AV1OBU obu;
    uint8_t *ptr = data, *end = data + size;
    av1d_dbg_func("enter ctx %p\n", ctx);

    *out_data = data;

    while (ptr < end) {
        RK_S32 len = av1_extract_obu(&obu, ptr, size);
        if (len < 0)
            break;
        if (obu.type == AV1_OBU_FRAME_HEADER || obu.type == AV1_OBU_FRAME ||
            ((obu.type == AV1_OBU_TEMPORAL_DELIMITER || obu.type == AV1_OBU_METADATA ||
              obu.type == AV1_OBU_SEQUENCE_HEADER) && ctx->frame_header))
            ctx->frame_header ++;
        if (ctx->frame_header == 2) {
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        if (obu.type == AV1_OBU_FRAME) {
            ptr      += len;
            size     -= len;
            *out_size = (RK_S32)(ptr - data);
            ctx->new_frame = 1;
            ctx->frame_header = 0;
            return ptr - data;
        }
        ptr      += len;
        size -= len;
    }

    *out_size = (RK_S32)(ptr - data);

    return ptr - data;

    av1d_dbg_func("leave ctx %p\n", ctx);

    return 0;
}